

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O3

void vkt::api::anon_unknown_1::createShaderProgs(SourceCollections *dst)

{
  ProgramSources *pPVar1;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  uint local_50;
  value_type local_48;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"test","");
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_70);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void) { gl_Position = a_position; }\n"
             ,"");
  local_50 = 0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_90,local_88 + (long)local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar1->sources + local_50,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void createShaderProgs (SourceCollections& dst)
{
	dst.glslSources.add("test") << glu::VertexSource(
		"#version 310 es\n"
		"in highp vec4 a_position;\n"
		"void main (void) { gl_Position = a_position; }\n");
}